

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O1

void __thiscall
vkt::pipeline::anon_unknown_0::TransferTestInstance::initialImageTransition
          (TransferTestInstance *this,VkCommandBuffer cmdBuffer,VkImage image,
          VkImageSubresourceRange subRange,VkImageLayout layout)

{
  DeviceInterface *pDVar1;
  undefined4 local_60 [2];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  VkImageLayout local_44;
  undefined8 local_40;
  deUint64 local_38;
  VkImageAspectFlags local_30;
  deUint32 dStack_2c;
  deUint32 dStack_28;
  deUint32 dStack_24;
  deUint32 local_20;
  
  pDVar1 = Context::getDeviceInterface
                     ((this->super_TimestampTestInstance).super_TestInstance.m_context);
  local_60[0] = 0x2d;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  local_40 = 0xffffffffffffffff;
  local_30 = subRange.aspectMask;
  dStack_2c = subRange.baseMipLevel;
  dStack_28 = subRange.levelCount;
  dStack_24 = subRange.baseArrayLayer;
  local_20 = subRange.layerCount;
  local_44 = layout;
  local_38 = image.m_internal;
  (*pDVar1->_vptr_DeviceInterface[0x6d])(pDVar1,cmdBuffer,0x4000,1,0,0,0,0,0,1,local_60);
  return;
}

Assistant:

void TransferTestInstance::initialImageTransition (VkCommandBuffer cmdBuffer, VkImage image, VkImageSubresourceRange subRange, VkImageLayout layout)
{
	const DeviceInterface&		vk				= m_context.getDeviceInterface();
	const VkImageMemoryBarrier	imageMemBarrier	=
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER, // VkStructureType          sType;
		DE_NULL,                                // const void*              pNext;
		0u,                                     // VkAccessFlags            srcAccessMask;
		0u,                                     // VkAccessFlags            dstAccessMask;
		VK_IMAGE_LAYOUT_UNDEFINED,              // VkImageLayout            oldLayout;
		layout,                                 // VkImageLayout            newLayout;
		VK_QUEUE_FAMILY_IGNORED,                // uint32_t                 srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,                // uint32_t                 dstQueueFamilyIndex;
		image,                                  // VkImage                  image;
		subRange                                // VkImageSubresourceRange  subresourceRange;
	};

	vk.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, 0, 0, DE_NULL, 0, DE_NULL, 1, &imageMemBarrier);
}